

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

uint objgetp(mcmcxdef *mctx,objnum objn,prpnum prop,dattyp *typptr)

{
  byte bVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  undefined6 in_register_00000032;
  ulong uVar8;
  mcmcxdef *pmVar9;
  uint uVar10;
  int iVar11;
  byte bVar12;
  uint16_t tmp;
  byte bVar13;
  uint uVar14;
  bool bVar15;
  
  uVar8 = CONCAT62(in_register_00000032,objn);
  bVar12 = (byte)prop;
  bVar13 = (byte)(prop >> 8);
  pmVar9 = mctx;
  puVar2 = mcmlck(mctx,objn);
  uVar3 = (uint)*(ushort *)(puVar2 + 6);
  if ((puVar2[2] & 2) != 0) {
    uVar14 = 0;
    if (uVar3 == 0) {
      uVar6 = 0;
    }
    else {
      uVar4 = uVar3 - 1;
      uVar10 = 0;
      do {
        iVar11 = uVar4 - uVar10;
        uVar7 = iVar11 / 2 + uVar10;
        uVar8 = (ulong)uVar7;
        pmVar9 = (mcmcxdef *)(puVar2 + (long)(int)uVar7 * 4 + (ulong)*(ushort *)(puVar2 + 8));
        bVar1 = *(byte *)&pmVar9->mcmcxgl;
        if ((bVar1 == bVar12) && (*(byte *)((long)&pmVar9->mcmcxgl + 1) == bVar13)) {
          uVar6 = (ulong)*(ushort *)((long)&pmVar9->mcmcxgl + 2);
          goto LAB_0021aa98;
        }
        if ((bVar1 < bVar12) ||
           ((bVar1 == bVar12 && (*(byte *)((long)&pmVar9->mcmcxgl + 1) < bVar13)))) {
          uVar10 = uVar10 + 1;
          if (2 < iVar11 + 1U) {
            uVar10 = uVar7;
          }
        }
        else {
          bVar15 = uVar7 != uVar4;
          uVar4 = uVar4 - 1;
          if (bVar15) {
            uVar4 = uVar7;
          }
        }
      } while ((int)uVar10 <= (int)uVar4);
      uVar6 = 0;
    }
LAB_0021aa98:
    do {
      uVar4 = (uint)uVar6;
      if (uVar4 == 0) goto LAB_0021aa9c;
      if (((((puVar2[uVar6 + 5] & 2) == 0) &&
           (((puVar2[uVar6 + 5] & 4) == 0 || ((mctx->mcmcxflg & 1) != 0)))) ||
          ((int)uVar3 <= (int)uVar8)) ||
         ((*(uchar *)&pmVar9->mcmcxgl != *(uchar *)((long)&pmVar9->mcmcxgl + 4) ||
          (*(uchar *)((long)&pmVar9->mcmcxgl + 1) != *(uchar *)((long)&pmVar9->mcmcxgl + 5)))))
      goto LAB_0021aa9e;
      uVar6 = (ulong)*(ushort *)((long)&pmVar9->mcmcxgl + 6);
      pmVar9 = (mcmcxdef *)((long)&pmVar9->mcmcxgl + 4);
    } while( true );
  }
  if (*(ushort *)(puVar2 + 6) == 0) {
    uVar4 = 0;
    uVar14 = 0;
  }
  else {
    pbVar5 = puVar2 + (ulong)*(ushort *)(puVar2 + 4) * 2 + 0xe;
    uVar14 = 0;
    do {
      if ((*pbVar5 == bVar12) && (pbVar5[1] == bVar13)) {
        if ((pbVar5[5] & 2) == 0) {
          if (((pbVar5[5] & 4) == 0) || ((mctx->mcmcxflg & 1) != 0)) {
            uVar4 = (int)pbVar5 - (int)puVar2;
            goto LAB_0021aa9e;
          }
        }
        else {
          uVar14 = (int)pbVar5 - (int)puVar2;
        }
      }
      pbVar5 = pbVar5 + (ulong)*(ushort *)(pbVar5 + 3) + 6;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
LAB_0021aa9c:
    uVar4 = 0;
  }
LAB_0021aa9e:
  if (uVar4 != 0) {
    uVar14 = uVar4;
  }
  if ((typptr != (dattyp *)0x0) && (uVar14 != 0)) {
    *typptr = (uint)puVar2[(ulong)uVar14 + 2];
  }
  mcmunlck(mctx,objn);
  return uVar14;
}

Assistant:

uint objgetp(mcmcxdef *mctx, objnum objn, prpnum prop, dattyp *typptr)
{
    objdef *objptr;
    prpdef *p;
    int     cnt;
    uint    retval;                       /* property offset, if we find it */
    uint    ignprop; /* ignored property - use if real property isn't found */
    uchar   pbuf[2];                  /* property number in portable format */
    uchar  *indp;
    uchar  *indbase;
    int     last;
    int     first;
    int     cur;
    
    oswp2(pbuf, prop);            /* get property number in portable foramt */
    objptr = (objdef *)mcmlck(mctx, objn);      /* get a lock on the object */
    ignprop = 0;                   /* assume we won't find ignored property */
    cnt = objnprop(objptr);             /* get number of properties defined */
    retval = 0;                                          /* presume failure */
    
    if (objflg(objptr) & OBJFINDEX)
    {
        /* there's an index -> do a binary search through the index */
        indbase = (uchar *)objpfre(objptr);                   /* find index */
        first = 0;
        last = cnt - 1;
        for (;;)
        {
            if (first > last) break;           /* crossed over -> not found */
            cur = first + (last - first)/2;         /* split the difference */
            indp = indbase + cur*4;            /* get pointer to this entry */
            if (indp[0] == pbuf[0] && indp[1] == pbuf[1])
            {
                retval = osrp2(indp + 2);
                break;
            }
            else if (indp[0] < pbuf[0]
                     || (indp[0] == pbuf[0] && indp[1] < pbuf[1]))
                first = (cur == first ? first + 1 : cur);
            else
                last = (cur == last ? last - 1 : cur);
        }

        /* ignore ignored and deleted properties if possible */
        while (retval
               && ((prpflg(objptr + retval) & PRPFIGN) != 0
                   || ((prpflg(objptr + retval) & PRPFDEL) != 0
                       && (mctx->mcmcxflg & MCMCXF_NO_PRP_DEL) == 0))
               && cur < cnt && indp[0] == indp[4] && indp[1] == indp[5])
        {
            indp += 4;
            retval = osrp2(indp + 2);
        }
        if (retval && osrp2(objptr + retval) != prop)
            assert(FALSE);
    }
    else
    {
        /* there's no index -> do sequential search through properties */
        for (p = objprp(objptr) ; cnt ; p = objpnxt(p), --cnt)
        {
            /* if this is the property, and it's not being ignored, use it */
            if (*(uchar *)p == pbuf[0] && *(((uchar *)p) + 1) == pbuf[1])
            {
                if (prpflg(p) & PRPFIGN)                 /* this is ignored */
                    ignprop = objpofs(objptr, p);  /* ... make a note of it */
                else if ((prpflg(p) & PRPFDEL) != 0         /* it's deleted */
                         && (mctx->mcmcxflg & MCMCXF_NO_PRP_DEL) == 0)
                    /* simply skip it */ ;
                else
                {
                    retval = objpofs(objptr, p);         /* this is the one */
                    break;                                    /* we're done */
                }
            }
        }
    }

    if (!retval) retval = ignprop;     /* use ignored value if nothing else */
    if (retval && typptr) *typptr = prptype(objofsp(objptr, retval));
    
    mcmunlck(mctx, objn);                 /* done with object, so unlock it */
    return(retval);
}